

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

int __thiscall TCPConnection::Read(TCPConnection *this,char *buffer,int size)

{
  ushort uVar1;
  int iVar2;
  
  iVar2 = 0x100 - (uint)this->RxOutOffset;
  if (size <= iVar2) {
    iVar2 = size;
  }
  memcpy(buffer,this->RxBuffer + this->RxOutOffset,(long)iVar2);
  uVar1 = this->RxOutOffset + (short)iVar2;
  if (0xff < uVar1) {
    uVar1 = 0;
  }
  this->RxOutOffset = uVar1;
  this->AcknowledgementNumber = this->AcknowledgementNumber + iVar2;
  this->CurrentWindow = this->CurrentWindow + (short)iVar2;
  if (uVar1 == this->RxInOffset) {
    this->RxBufferEmpty = true;
  }
  return iVar2;
}

Assistant:

int TCPConnection::Read(char* buffer, int size)
{
    int bytes_to_read = std::min(size, TCP_RX_WINDOW_SIZE - RxOutOffset);

    memcpy(buffer, &RxBuffer[RxOutOffset], bytes_to_read);

    RxOutOffset += bytes_to_read;
    if (RxOutOffset >= TCP_RX_WINDOW_SIZE)
    {
        RxOutOffset = 0;
    }
    AcknowledgementNumber += bytes_to_read;
    CurrentWindow += bytes_to_read;

    if (RxOutOffset == RxInOffset)
    {
        RxBufferEmpty = true;
    }

    return bytes_to_read;
}